

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::TransformFeedbackBuiltin::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 430                         \nin vec4 position;                    \nout ivec4 a;                         \nout uvec2 c;                         \nout uint d;                          \nout int f;                           \nout uint e;                          \nout int g;                           \nvoid main(void)                      \n{                                    \n   vec4 pos;                         \n   a = ivec4(1);                     \n   c = uvec2(1u);                    \n   d = 1u;                           \n   f = 1;                            \n   e = 1u;                           \n   g = 1;                            \n   gl_Position = position;           \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 430                         \n"
			   "in vec4 position;                    \n"
			   ""
			   "out ivec4 a;                         \n"
			   "out uvec2 c;                         \n"
			   "out uint d;                          \n"
			   "out int f;                           \n"
			   "out uint e;                          \n"
			   "out int g;                           \n"
			   ""
			   "void main(void)                      \n"
			   "{                                    \n"
			   "   vec4 pos;                         \n"
			   "   a = ivec4(1);                     \n"
			   "   c = uvec2(1u);                    \n"
			   "   d = 1u;                           \n"
			   "   f = 1;                            \n"
			   "   e = 1u;                           \n"
			   "   g = 1;                            \n"
			   "   gl_Position = position;           \n"
			   "}";
	}